

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

void enable_interrupt(ixgbe_device *dev,uint16_t queue_id)

{
  uint8_t uVar1;
  
  if ((dev->ixy).interrupts.interrupts_enabled == true) {
    uVar1 = (dev->ixy).interrupts.interrupt_type;
    if (uVar1 == '\x01') {
      enable_interrupt_cold_1();
    }
    else {
      if (uVar1 != '\x02') {
        fprintf(_stderr,"[WARN ] %s:%d %s(): Interrupt type not supported: %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0xdd,"enable_interrupt");
        return;
      }
      enable_interrupt_cold_2();
    }
  }
  return;
}

Assistant:

static void enable_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	if (!dev->ixy.interrupts.interrupts_enabled) {
		return;
	}
	switch (dev->ixy.interrupts.interrupt_type) {
		case VFIO_PCI_MSIX_IRQ_INDEX:
			enable_msix_interrupt(dev, queue_id);
			break;
		case VFIO_PCI_MSI_IRQ_INDEX:
			enable_msi_interrupt(dev, queue_id);
			break;
		default:
			warn("Interrupt type not supported: %d", dev->ixy.interrupts.interrupt_type);
			return;
	}
}